

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpn.cpp
# Opt level: O0

void rpn_Symbol(Expression *expr,char *symName)

{
  bool bVar1;
  int iVar2;
  uint32_t i;
  Symbol *pSVar3;
  Section *pSVar4;
  char *pcVar5;
  int *piVar6;
  size_t sVar7;
  uint8_t *puVar8;
  char *pcVar9;
  uint8_t *ptr;
  size_t nameLen;
  int size;
  Expression *_expr;
  Symbol *sym;
  char *symName_local;
  Expression *expr_local;
  
  pSVar3 = sym_FindScopedSymbol(symName);
  bVar1 = sym_IsPC(pSVar3);
  if ((bVar1) && (pSVar4 = sect_GetSymbolSection(), pSVar4 == (Section *)0x0)) {
    error("PC has no value outside a section\n");
    rpn_Number(expr,0);
  }
  else if ((pSVar3 == (Symbol *)0x0) || (bVar1 = sym_IsConstant(pSVar3), !bVar1)) {
    rpn_Init(expr);
    expr->isSymbol = true;
    expr->isKnown = false;
    pcVar5 = (char *)malloc(0x80);
    expr->reason = pcVar5;
    if (expr->reason == (char *)0x0) {
      piVar6 = __errno_location();
      pcVar5 = strerror(*piVar6);
      fatalerror("Can\'t allocate err string: %s\n",pcVar5);
    }
    pcVar5 = expr->reason;
    bVar1 = sym_IsPC(pSVar3);
    pcVar9 = "\'%s\' is not constant at assembly time";
    if (bVar1) {
      pcVar9 = "PC is not constant at assembly time";
    }
    iVar2 = snprintf(pcVar5,0x80,pcVar9,symName);
    if (0x7f < iVar2) {
      pcVar5 = (char *)realloc(expr->reason,(long)(iVar2 + 1));
      expr->reason = pcVar5;
      if (expr->reason == (char *)0x0) {
        piVar6 = __errno_location();
        pcVar5 = strerror(*piVar6);
        fatalerror("Can\'t allocate err string: %s\n",pcVar5);
      }
      pcVar5 = expr->reason;
      bVar1 = sym_IsPC(pSVar3);
      pcVar9 = "\'%s\' is not constant at assembly time";
      if (bVar1) {
        pcVar9 = "PC is not constant at assembly time";
      }
      sprintf(pcVar5,pcVar9,symName);
    }
    pSVar3 = sym_Ref(symName);
    expr->rpnPatchSize = expr->rpnPatchSize + 5;
    sVar7 = strlen(pSVar3->name);
    puVar8 = reserveSpace(expr,(int)(sVar7 + 1) + 1);
    *puVar8 = 0x81;
    memcpy(puVar8 + 1,pSVar3,sVar7 + 1);
  }
  else {
    i = sym_GetConstantValue(symName);
    rpn_Number(expr,i);
  }
  return;
}

Assistant:

void rpn_Symbol(struct Expression *expr, char const *symName)
{
	struct Symbol *sym = sym_FindScopedSymbol(symName);

	if (sym_IsPC(sym) && !sect_GetSymbolSection()) {
		error("PC has no value outside a section\n");
		rpn_Number(expr, 0);
	} else if (!sym || !sym_IsConstant(sym)) {
		rpn_Init(expr);
		expr->isSymbol = true;

		makeUnknown(expr, sym_IsPC(sym) ? "PC is not constant at assembly time"
						: "'%s' is not constant at assembly time", symName);
		sym = sym_Ref(symName);
		expr->rpnPatchSize += 5; // 1-byte opcode + 4-byte symbol ID

		size_t nameLen = strlen(sym->name) + 1; // Don't forget NUL!
		uint8_t *ptr = reserveSpace(expr, nameLen + 1);
		*ptr++ = RPN_SYM;
		memcpy(ptr, sym->name, nameLen);
	} else {
		rpn_Number(expr, sym_GetConstantValue(symName));
	}
}